

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O3

Dch_Cla_t * Dch_ClassesStart(Aig_Man_t *pAig)

{
  int nIdMax;
  Dch_Cla_t *pDVar1;
  Aig_Obj_t ***pppAVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  
  pDVar1 = (Dch_Cla_t *)calloc(1,0x68);
  pDVar1->pAig = pAig;
  nIdMax = pAig->vObjs->nSize;
  pppAVar2 = (Aig_Obj_t ***)calloc((long)nIdMax,8);
  pDVar1->pId2Class = pppAVar2;
  piVar3 = (int *)calloc((long)nIdMax,4);
  pDVar1->pClassSizes = piVar3;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pDVar1->vClassOld = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pDVar1->vClassNew = pVVar4;
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    Aig_ManReprStart(pAig,nIdMax);
    return pDVar1;
  }
  __assert_fail("pAig->pReprs == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                ,0x93,"Dch_Cla_t *Dch_ClassesStart(Aig_Man_t *)");
}

Assistant:

Dch_Cla_t * Dch_ClassesStart( Aig_Man_t * pAig )
{
    Dch_Cla_t * p;
    p = ABC_ALLOC( Dch_Cla_t, 1 );
    memset( p, 0, sizeof(Dch_Cla_t) );
    p->pAig         = pAig;
    p->pId2Class    = ABC_CALLOC( Aig_Obj_t **, Aig_ManObjNumMax(pAig) );
    p->pClassSizes  = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->vClassOld    = Vec_PtrAlloc( 100 );
    p->vClassNew    = Vec_PtrAlloc( 100 );
    assert( pAig->pReprs == NULL );
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    return p;
}